

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::apply
          (QControlledGate2<std::complex<float>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<float>_> *matrix,int offset)

{
  complex<float> *pcVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  long lVar8;
  long lVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int64_t i_2;
  char *__assertion;
  long lVar16;
  int64_t i_1;
  long lVar17;
  long lVar18;
  int64_t i;
  ulong uVar19;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Da_05;
  float extraout_XMM0_Da_06;
  float extraout_XMM0_Da_07;
  float extraout_XMM0_Da_08;
  float extraout_XMM0_Da_09;
  float extraout_XMM0_Da_10;
  float extraout_XMM0_Da_11;
  float extraout_XMM0_Da_12;
  float extraout_XMM0_Da_13;
  float extraout_XMM0_Da_14;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  float extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  float extraout_XMM0_Db_05;
  float extraout_XMM0_Db_06;
  float extraout_XMM0_Db_07;
  float extraout_XMM0_Db_08;
  float extraout_XMM0_Db_09;
  float extraout_XMM0_Db_10;
  float extraout_XMM0_Db_11;
  float extraout_XMM0_Db_12;
  float extraout_XMM0_Db_13;
  float extraout_XMM0_Db_14;
  matrix_type mat1;
  long local_c0;
  long local_b8;
  complex<float> x1;
  complex<float> x2;
  vector<int,_std::allocator<int>_> qubits;
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    uVar4 = 0x2e;
  }
  else {
    bVar11 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar11 & 0x1f))) {
      (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject
        [5])(&qubits);
      iVar6 = *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = iVar6 + offset;
      iVar7 = qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[1];
      qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [1] = offset + iVar7;
      if (iVar6 + offset < nbQubits) {
        if (offset + iVar7 < nbQubits) {
          iVar6 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                    _vptr_QObject[0x10])();
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x38))
                    (&mat1,(long *)CONCAT44(extraout_var,iVar6));
          dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>(op,&mat1);
          iVar6 = this->control_;
          iVar7 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>.
                    _vptr_QObject[0xf])();
          if (iVar6 < iVar7) {
            iVar6 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>
                      ._vptr_QObject[0xf])(this);
            bVar2 = (char)iVar6 - (char)this->control_ & 0x1f;
            iVar6 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>
                      ._vptr_QObject[0xf])(this);
            iVar7 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>
                      ._vptr_QObject[0xf])(this);
            bVar3 = (byte)iVar6 & 0x1f;
            lVar13 = (long)(1 << bVar2);
            lVar17 = (long)(1 << (~(byte)iVar7 + bVar11 & 0x1f));
            lVar14 = 0;
            if (0 < lVar17) {
              lVar14 = lVar17;
            }
            uVar4 = 1 << bVar3;
            if (1 << bVar3 < 1) {
              uVar4 = 0;
            }
            lVar8 = (long)((1 << bVar2) / 2);
            if (side == Left) {
              for (uVar19 = (ulong)(uint)(0 << bVar2); (long)uVar19 < matrix->size_;
                  uVar19 = uVar19 + 1) {
                local_c0 = 0;
                for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                  lVar10 = local_c0;
                  lVar16 = lVar14;
                  if (this->controlState_ == 1) {
                    if (lVar8 <= (long)uVar12 % lVar13) goto LAB_0010deba;
                  }
                  else if ((this->controlState_ != 0) || ((long)uVar12 % lVar13 < lVar8)) {
LAB_0010deba:
                    while (lVar16 != 0) {
                      pcVar1 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      x1._M_value = pcVar1[matrix->size_ * lVar10 + uVar19]._M_value;
                      x2._M_value = pcVar1[matrix->size_ * (lVar17 + lVar10) + uVar19]._M_value;
                      std::operator*((complex<float> *)
                                     mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl,&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 8),&x2);
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [matrix->size_ * lVar10 + uVar19]._M_value =
                           CONCAT44(extraout_XMM0_Db + extraout_XMM0_Db_00,
                                    extraout_XMM0_Da + extraout_XMM0_Da_00);
                      std::operator*((complex<float> *)
                                     (mat1.size_ * 8 +
                                     (long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl),&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat1.size_ * 8 + 8),&x2);
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [(lVar17 + lVar10) * matrix->size_ + uVar19]._M_value =
                           CONCAT44(extraout_XMM0_Db_01 + extraout_XMM0_Db_02,
                                    extraout_XMM0_Da_01 + extraout_XMM0_Da_02);
                      lVar10 = lVar10 + 1;
                      lVar16 = lVar16 + -1;
                    }
                  }
                  local_c0 = local_c0 + lVar17 * 2;
                }
              }
            }
            else {
              uVar19 = (ulong)(uint)(0 << bVar2);
              for (lVar10 = 0; lVar10 < matrix->size_; lVar10 = lVar10 + 1) {
                local_c0 = 0;
                for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                  lVar16 = local_c0;
                  lVar18 = lVar14;
                  if (this->controlState_ == 1) {
                    if (lVar8 <= (long)uVar12 % lVar13) goto LAB_0010e3b4;
                  }
                  else if ((this->controlState_ != 0) || ((long)uVar12 % lVar13 < lVar8)) {
LAB_0010e3b4:
                    while (lVar18 != 0) {
                      lVar9 = matrix->size_ * uVar19;
                      pcVar1 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      x1._M_value = *(_ComplexT_conflict *)
                                     ((long)&pcVar1->_M_value + lVar16 + lVar9);
                      x2._M_value = *(_ComplexT_conflict *)
                                     ((long)&pcVar1[lVar17]._M_value + lVar16 + lVar9);
                      std::operator*((complex<float> *)
                                     mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl,&x1);
                      std::operator*((complex<float> *)
                                     (mat1.size_ * 8 +
                                     (long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl),&x2);
                      *(ulong *)((long)&((matrix->data_)._M_t.
                                         super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                         .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl)->_M_value + lVar16 + matrix->size_ * uVar19) =
                           CONCAT44(extraout_XMM0_Db_11 + extraout_XMM0_Db_12,
                                    extraout_XMM0_Da_11 + extraout_XMM0_Da_12);
                      std::operator*((complex<float> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 8),&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat1.size_ * 8 + 8),&x2);
                      *(ulong *)((long)&(matrix->data_)._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl[lVar17]._M_value +
                                lVar16 + matrix->size_ * uVar19) =
                           CONCAT44(extraout_XMM0_Db_13 + extraout_XMM0_Db_14,
                                    extraout_XMM0_Da_13 + extraout_XMM0_Da_14);
                      lVar16 = lVar16 + 8;
                      lVar18 = lVar18 + -1;
                    }
                  }
                  local_c0 = local_c0 + lVar17 * 0x10;
                }
                uVar19 = uVar19 + 8;
              }
            }
          }
          else {
            iVar15 = 1 << (bVar11 - (char)this->control_ & 0x1f);
            iVar6 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>
                      ._vptr_QObject[0xf])(this);
            iVar7 = (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>
                      ._vptr_QObject[0xf])(this);
            bVar2 = (byte)iVar6 & 0x1f;
            lVar13 = (long)iVar15;
            bVar11 = ~(byte)iVar7 + bVar11 & 0x1f;
            lVar17 = (long)(1 << bVar11);
            lVar14 = 0;
            if (0 < lVar17) {
              lVar14 = lVar17;
            }
            uVar4 = 1 << bVar2;
            if (1 << bVar2 < 1) {
              uVar4 = 0;
            }
            lVar8 = (long)(iVar15 / 2);
            if (side == Left) {
              for (uVar19 = (ulong)(uint)(0 << bVar11); (long)uVar19 < matrix->size_;
                  uVar19 = uVar19 + 1) {
                local_b8 = 0;
                for (uVar12 = 0; uVar12 != uVar4; uVar12 = uVar12 + 1) {
                  for (lVar10 = 0; lVar14 != lVar10; lVar10 = lVar10 + 1) {
                    if (this->controlState_ == 1) {
                      if (lVar8 <= lVar10 % lVar13) goto LAB_0010e09b;
                    }
                    else if ((this->controlState_ != 0) || (lVar10 % lVar13 < lVar8)) {
LAB_0010e09b:
                      lVar16 = local_b8 + lVar17 + lVar10;
                      pcVar1 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      x1._M_value = pcVar1[matrix->size_ * (local_b8 + lVar10) + uVar19]._M_value;
                      x2._M_value = pcVar1[matrix->size_ * lVar16 + uVar19]._M_value;
                      std::operator*((complex<float> *)
                                     mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl,&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 8),&x2);
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [(local_b8 + lVar10) * matrix->size_ + uVar19]._M_value =
                           CONCAT44(extraout_XMM0_Db_03 + extraout_XMM0_Db_04,
                                    extraout_XMM0_Da_03 + extraout_XMM0_Da_04);
                      std::operator*((complex<float> *)
                                     (mat1.size_ * 8 +
                                     (long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl),&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat1.size_ * 8 + 8),&x2);
                      (matrix->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar16 * matrix->size_ + uVar19]._M_value =
                           CONCAT44(extraout_XMM0_Db_05 + extraout_XMM0_Db_06,
                                    extraout_XMM0_Da_05 + extraout_XMM0_Da_06);
                    }
                  }
                  local_b8 = local_b8 + lVar17 * 2;
                }
              }
            }
            else {
              lVar16 = 0;
              for (lVar10 = 0; lVar10 < matrix->size_; lVar10 = lVar10 + 1) {
                lVar18 = 0;
                for (uVar19 = 0; uVar19 != uVar4; uVar19 = uVar19 + 1) {
                  for (lVar9 = 0; lVar14 != lVar9; lVar9 = lVar9 + 1) {
                    if (this->controlState_ == 1) {
                      if (lVar8 <= lVar9 % lVar13) goto LAB_0010e22c;
                    }
                    else if ((this->controlState_ != 0) || (lVar9 % lVar13 < lVar8)) {
LAB_0010e22c:
                      pcVar1 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
                      lVar5 = lVar18 + matrix->size_ * lVar16;
                      x1._M_value = *(_ComplexT_conflict *)((long)&pcVar1[lVar9]._M_value + lVar5);
                      x2._M_value = *(_ComplexT_conflict *)
                                     ((long)&pcVar1[lVar9 + lVar17]._M_value + lVar5);
                      std::operator*((complex<float> *)
                                     mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                     .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                     _M_head_impl,&x1);
                      std::operator*((complex<float> *)
                                     (mat1.size_ * 8 +
                                     (long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                           .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                           _M_head_impl),&x2);
                      *(ulong *)((long)&(matrix->data_)._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl[lVar9]._M_value +
                                lVar18 + matrix->size_ * lVar16) =
                           CONCAT44(extraout_XMM0_Db_07 + extraout_XMM0_Db_08,
                                    extraout_XMM0_Da_07 + extraout_XMM0_Da_08);
                      std::operator*((complex<float> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + 8),&x1);
                      std::operator*((complex<float> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                            .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                            _M_head_impl + mat1.size_ * 8 + 8),&x2);
                      *(ulong *)((long)&(matrix->data_)._M_t.
                                        super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                        .super__Head_base<0UL,_std::complex<float>_*,_false>.
                                        _M_head_impl[lVar17 + lVar9]._M_value +
                                lVar18 + matrix->size_ * lVar16) =
                           CONCAT44(extraout_XMM0_Db_09 + extraout_XMM0_Db_10,
                                    extraout_XMM0_Da_09 + extraout_XMM0_Da_10);
                    }
                  }
                  lVar18 = lVar18 + lVar17 * 0x10;
                }
                lVar16 = lVar16 + 8;
              }
            }
          }
          std::unique_ptr<std::complex<float>[],_std::default_delete<std::complex<float>[]>_>::
          ~unique_ptr(&mat1.data_);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&qubits.super__Vector_base<int,_std::allocator<int>_>);
          return;
        }
        __assertion = "qubits[1] < nbQubits";
      }
      else {
        __assertion = "qubits[0] < nbQubits";
      }
      uVar4 = 0x33;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      uVar4 = 0x2f;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QControlledGate2.cpp"
                ,uVar4,
                "virtual void qclab::qgates::QControlledGate2<std::complex<float>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<float>]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }